

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shuff.hpp
# Opt level: O1

void shuff_calculate_minimum_redundancy(uint64_t *freq,uint64_t *syms,int64_t n)

{
  long lVar1;
  long lVar2;
  uint64_t uVar3;
  long lVar4;
  ulong uVar5;
  uint64_t *puVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  uint64_t *puVar10;
  bool bVar11;
  
  if (n != 0) {
    if (n == 1) {
      freq[*syms] = 0;
      return;
    }
    freq[*syms] = freq[*syms] + freq[syms[1]];
    if (2 < n) {
      lVar2 = 2;
      puVar6 = syms + 1;
      uVar7 = 1;
      lVar8 = 0;
      do {
        if ((lVar2 < n) && (uVar5 = freq[syms[lVar2]], uVar5 <= freq[syms[lVar8]])) {
          lVar2 = lVar2 + 1;
          puVar10 = puVar6;
        }
        else {
          puVar10 = syms + lVar8;
          freq[*puVar6] = freq[*puVar10];
          lVar8 = lVar8 + 1;
          uVar5 = uVar7;
        }
        freq[*puVar10] = uVar5;
        if ((lVar2 < n) && (((long)uVar7 <= lVar8 || (freq[syms[lVar2]] <= freq[syms[lVar8]])))) {
          puVar10 = syms + lVar2;
          lVar2 = lVar2 + 1;
          freq[*puVar6] = freq[*puVar6] + freq[*puVar10];
        }
        else {
          freq[*puVar6] = freq[*puVar6] + freq[syms[lVar8]];
          puVar10 = syms + lVar8;
          lVar8 = lVar8 + 1;
          freq[*puVar10] = uVar7;
        }
        lVar4 = (3 - n) + uVar7;
        uVar7 = uVar7 + 1;
        puVar6 = puVar6 + 1;
      } while (lVar4 != 1);
    }
    freq[syms[n + -2]] = 0;
    lVar2 = n;
    if (2 < n) {
      do {
        freq[syms[lVar2 + -3]] = freq[syms[freq[syms[lVar2 + -3]]]] + 1;
        lVar8 = lVar2 + -3;
        bVar11 = lVar2 != 3;
        lVar2 = lVar2 + -1;
      } while (bVar11 && -1 < lVar8);
    }
    lVar2 = n + -1;
    lVar4 = n + -2;
    lVar8 = 1;
    uVar3 = 0;
    do {
      if (lVar4 < 0) {
        lVar9 = 0;
      }
      else {
        lVar1 = lVar4 + 1;
        lVar9 = 0;
        do {
          if (freq[syms[lVar4]] != uVar3) goto LAB_00120d69;
          lVar9 = lVar9 + 1;
          lVar4 = lVar4 + -1;
        } while (lVar1 != lVar9);
        lVar4 = -1;
        lVar9 = lVar1;
      }
LAB_00120d69:
      for (; lVar9 < lVar8; lVar8 = lVar8 + -1) {
        puVar6 = syms + lVar2;
        lVar2 = lVar2 + -1;
        freq[*puVar6] = uVar3;
      }
      lVar8 = lVar9 * 2;
      uVar3 = uVar3 + 1;
    } while (lVar9 != 0);
  }
  return;
}

Assistant:

void shuff_calculate_minimum_redundancy(
    uint64_t freq[], uint64_t syms[], int64_t n)
{
    int64_t root; /* next root node to be used */
    int64_t leaf; /* next leaf to be used */
    int64_t next; /* next value to be assigned */
    int64_t avbl; /* number of available nodes */
    int64_t used; /* number of internal nodes */
    uint64_t dpth; /* current depth of leaves */

    /* check for pathological cases */
    if (n == 0) {
        return;
    }
    if (n == 1) {
        freq[syms[0]] = 0;
        return;
    }

    /* first pass, left to right, setting parent pointers */
    freq[syms[0]] += freq[syms[1]];
    root = 0;
    leaf = 2;
    for (next = 1; next < n - 1; next++) {
        /* select first item for a pairing */
        if (leaf >= n || freq[syms[root]] < freq[syms[leaf]]) {
            freq[syms[next]] = freq[syms[root]];
            freq[syms[root++]] = next;
        } else
            freq[syms[next]] = freq[syms[leaf++]];

        /* add on the second item */
        if (leaf >= n || (root < next && freq[syms[root]] < freq[syms[leaf]])) {
            freq[syms[next]] += freq[syms[root]];
            freq[syms[root++]] = next;
        } else
            freq[syms[next]] += freq[syms[leaf++]];
    }

    /* second pass, right to left, setting internal depths */
    freq[syms[n - 2]] = 0;
    for (next = n - 3; next >= 0; next--)
        freq[syms[next]] = freq[syms[freq[syms[next]]]] + 1;

    /* third pass, right to left, setting leaf depths */
    avbl = 1;
    used = dpth = 0;
    root = n - 2;
    next = n - 1;
    while (avbl > 0) {
        while (root >= 0 && freq[syms[root]] == dpth) {
            used++;
            root--;
        }
        while (avbl > used) {
            freq[syms[next--]] = dpth;
            avbl--;
        }
        avbl = 2 * used;
        dpth++;
        used = 0;
    }
}